

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

MemberInfo * __thiscall
kj::Arena::
allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int&,capnp::compiler::Declaration::Param::Reader&,capnp::compiler::NodeTranslator::StructLayout::StructOrGroup&,bool>
          (Arena *this,MemberInfo *params,uint *params_1,Reader *params_2,StructOrGroup *params_3,
          bool *params_4)

{
  MemberInfo *this_00;
  
  this_00 = (MemberInfo *)allocateBytes(this,0x1a0,8,true);
  capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
            (this_00,params,*params_1,params_2,params_3,*params_4);
  setDestructor(this,this_00,
                destroyObject<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo>);
  return this_00;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !KJ_HAS_TRIVIAL_DESTRUCTOR(T)));
  if (!KJ_HAS_TRIVIAL_CONSTRUCTOR(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}